

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
::visit_byte_string(json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                    *this,byte_string_view *b,semantic_tag tag,ser_context *param_4,
                   error_code *param_5)

{
  byte_string_arg_t *__args_2;
  reference pvVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RCX;
  undefined1 in_DL;
  undefined8 in_RSI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  unsigned_long *in_R8;
  undefined4 in_stack_ffffffffffffffb0;
  structure_type sVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffe0;
  
  pvVar1 = std::
           vector<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
           ::back((vector<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                   *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  sVar2 = pvVar1->type_;
  if (sVar2 == root_t) {
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::
    basic_json<jsoncons::byte_string_view>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               &stack0xffffffffffffffb8,in_RSI,in_DL,(undefined1 *)((long)&in_RDI->field_0 + 8),0);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,sVar2),in_RDI);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x3762bd);
    *(undefined1 *)((long)&in_RDI[7].field_0 + 8) = 1;
  }
  else if (sVar2 == array_t || sVar2 == object_t) {
    __args_2 = *(byte_string_arg_t **)&in_RDI[2].field_0;
    *(byte_string_arg_t **)&in_RDI[2].field_0 = __args_2 + 1;
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<std::__cxx11::wstring,unsigned_long,jsoncons::byte_string_arg_t_const&,jsoncons::byte_string_view_const&,jsoncons::semantic_tag&>
              ((vector<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),in_RCX,in_R8,__args_2,
               (byte_string_view *)in_stack_ffffffffffffffc0,
               (semantic_tag *)in_stack_ffffffffffffffb8);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
                           semantic_tag tag, 
                           const ser_context&,
                           std::error_code&) override
    {
        switch (structure_stack_.back().type_)
        {
            case structure_type::object_t:
            case structure_type::array_t:
                item_stack_.emplace_back(std::move(name_), index_++, byte_string_arg, b, tag);
                break;
            case structure_type::root_t:
                result_ = Json(byte_string_arg, b, tag, allocator_);
                is_valid_ = true;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }